

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QTimeEdit::QTimeEdit(QTimeEdit *this,QTime time,QWidget *parent)

{
  char cVar1;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  code *local_70;
  ImplFn local_68;
  QObject local_60 [8];
  QTime local_58;
  QTime time_local;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  time_local = time;
  cVar1 = QTime::isValid();
  if (cVar1 == '\0') {
    QTime::QTime(&local_58,0,0,0,0);
  }
  else {
    local_58.mds = time_local.mds;
  }
  ::QVariant::QVariant(&local_50,local_58);
  QDateTimeEdit::QDateTimeEdit(&this->super_QDateTimeEdit,&local_50,QTime,parent);
  ::QVariant::~QVariant(&local_50);
  *(undefined ***)&(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget =
       &PTR_metaObject_007ff0e0;
  *(undefined ***)
   &(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget.super_QPaintDevice =
       &PTR__QTimeEdit_007ff2d0;
  local_70 = userTimeChanged;
  local_68 = (ImplFn)0x0;
  local_50.d.data.shared = (PrivateShared *)QDateTimeEdit::timeChanged;
  local_50.d.data._8_8_ = 0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QCallableObject<void_(QTimeEdit::*)(QTime),_QtPrivate::List<QTime>,_void>::impl;
  *(code **)(puVar2 + 4) = userTimeChanged;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)this,(QObject *)&local_50,(void **)this,(QSlotObjectBase *)&local_70,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTimeEdit::QTimeEdit(QTime time, QWidget *parent)
    : QDateTimeEdit(time.isValid() ? time : QDATETIMEEDIT_TIME_MIN, QMetaType::QTime, parent)
{
    connect(this, &QTimeEdit::timeChanged, this, &QTimeEdit::userTimeChanged);
}